

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Floor::~Floor(Floor *this)

{
  Floor *this_local;
  
  ~Floor(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Floor (void) : PreciseFunc1("floor", deFloor) {}